

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O2

void TestSeekAndTell(void)

{
  ostream *poVar1;
  int iVar2;
  istream *piVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined **local_470;
  undefined1 local_468;
  undefined8 *local_460;
  char *local_458;
  long local_450 [2];
  undefined1 local_440 [16];
  string junk;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  const_string local_3d0;
  const_string local_3c0;
  const_string local_3b0;
  const_string local_3a0;
  const_string local_390;
  const_string local_380;
  const_string local_370;
  const_string local_360;
  char *local_350;
  char *local_348;
  const_string local_340;
  const_string local_330;
  istream is;
  ostream os;
  
  os.super_ostream._vptr_basic_ostream = (_func_int **)anon_var_dwarf_8f9cc;
  os.super_ostream._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
       + 0x6d;
  os.super_ostream._16_8_ = 0x1d8;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&os);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  junk._M_dataplus._M_p._0_1_ = 1;
  is.super_istream._M_gcount._0_1_ = 0;
  is.super_istream._vptr_basic_istream = (_func_int **)&PTR__lazy_ostream_001e9e08;
  is.super_istream._16_8_ = &boost::unit_test::lazy_ostream::inst;
  is.super_istream._24_8_ = anon_var_dwarf_90cef;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&junk,(lazy_ostream *)&is);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&junk);
  makeString_abi_cxx11_(&junk,0x800);
  avro::ostream::ostream(&os);
  iVar2 = 5;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    std::operator<<(&os.super_ostream,(string *)&junk);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Buffer has ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," bytes\n");
  piVar3 = &is;
  avro::istream::istream(piVar3,(OutputBuffer *)&os.super_ostream.field_0x48);
  local_330.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_330.m_end = "";
  local_340.m_begin = "";
  local_340.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)piVar3,&local_330,0x1e9,&local_340);
  local_468 = 0;
  local_470 = &PTR__lazy_ostream_001ea848;
  local_460 = &boost::unit_test::lazy_ostream::inst;
  local_458 = "";
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_348 = "";
  local_440._0_8_ = *(undefined8 *)(is.super_istream._80_8_ + 0xa8);
  local_450[0] = junk._M_string_length * 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_470,&local_350,0x1e9,1,2,local_440,"is.getBuffer().size()",local_450,
             "junk.size() * i");
  piVar3 = &is;
  std::istream::seekg(piVar3,2000,0);
  local_360.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_360.m_end = "";
  local_370.m_begin = "";
  local_370.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)piVar3,&local_360,0x1eb,&local_370);
  local_468 = 0;
  local_470 = &PTR__lazy_ostream_001ea848;
  local_460 = &boost::unit_test::lazy_ostream::inst;
  local_458 = "";
  local_3e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3d8 = "";
  local_440 = std::istream::tellg();
  local_450[0] = 2000;
  local_450[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
            (&local_470,&local_3e0,0x1eb,1,2,local_440,"is.tellg()",local_450,
             "static_cast<std::streampos>(2000)");
  piVar3 = &is;
  std::istream::seekg(piVar3,6000,0);
  local_380.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_380.m_end = "";
  local_390.m_begin = "";
  local_390.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)piVar3,&local_380,0x1ed,&local_390);
  local_468 = 0;
  local_470 = &PTR__lazy_ostream_001ea848;
  local_460 = &boost::unit_test::lazy_ostream::inst;
  local_458 = "";
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3e8 = "";
  auVar5 = std::istream::tellg();
  local_450[0] = 6000;
  local_450[1] = 0;
  local_440 = auVar5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
            (&local_470,&local_3f0,0x1ed,1,2,local_440,"is.tellg()",local_450,
             "static_cast<std::streampos>(6000)");
  piVar3 = &is;
  std::istream::seekg(piVar3,*(undefined8 *)(is.super_istream._80_8_ + 0xa8),0);
  local_3a0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3a0.m_end = "";
  local_3b0.m_begin = "";
  local_3b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)piVar3,&local_3a0,0x1ef,&local_3b0);
  local_468 = 0;
  local_470 = &PTR__lazy_ostream_001ea848;
  local_460 = &boost::unit_test::lazy_ostream::inst;
  local_458 = "";
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3f8 = "";
  auVar5 = std::istream::tellg();
  local_450[0] = *(long *)(is.super_istream._80_8_ + 0xa8);
  local_450[1] = 0;
  local_440 = auVar5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
            (&local_470,&local_400,0x1ef,1,2,local_440,"is.tellg()",local_450,
             "static_cast<std::streampos>(is.getBuffer().size())");
  piVar3 = &is;
  std::istream::seekg(piVar3,*(long *)(is.super_istream._80_8_ + 0xa8) + 1,0);
  local_3c0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_3c0.m_end = "";
  local_3d0.m_begin = "";
  local_3d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)piVar3,&local_3c0,0x1f1,&local_3d0);
  local_468 = 0;
  local_470 = &PTR__lazy_ostream_001ea848;
  local_460 = &boost::unit_test::lazy_ostream::inst;
  local_458 = "";
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_408 = "";
  auVar5 = std::istream::tellg();
  local_450[0] = -1;
  local_450[1] = 0;
  local_440 = auVar5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::fpos<__mbstate_t>,std::fpos<__mbstate_t>>
            (&local_470,&local_410,0x1f1,1,2,local_440,"is.tellg()",local_450,
             "static_cast<std::streampos>(-1)");
  avro::istream::~istream(&is);
  avro::ostream::~ostream(&os);
  std::__cxx11::string::~string((string *)&junk);
  return;
}

Assistant:

void TestSeekAndTell()
{
    BOOST_TEST_MESSAGE( "TestSeekAndTell");

    {
        std::string junk = makeString(kDefaultBlockSize/2);

        ostream os;

        // write enough bytes to a buffer, to create at least 3 blocks
        int i = 0;
        for(; i < 5; ++i) {
            os << junk;
        }

        const OutputBuffer &buf = os.getBuffer();
        cout << "Buffer has " << buf.size() << " bytes\n";

        istream is(os.getBuffer());
        BOOST_CHECK_EQUAL(is.getBuffer().size(), junk.size() * i);
        is.seekg(2000);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(2000));
        is.seekg(6000);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(6000));
        is.seekg(is.getBuffer().size());
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(is.getBuffer().size()));
        is.seekg(is.getBuffer().size()+1);
        BOOST_CHECK_EQUAL(is.tellg(), static_cast<std::streampos>(-1));

    }
}